

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::cose::Sign1Message::AddAttribute
          (Error *__return_storage_ptr__,Sign1Message *this,int aKey,ByteArray *aValue,int aFlags)

{
  bool bVar1;
  const_reference data;
  size_type sVar2;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  ErrorCode local_284;
  Error local_280;
  anon_class_1_0_00000001 local_252;
  v10 local_251;
  v10 *local_250;
  size_t local_248;
  string local_240;
  Error local_220;
  anon_class_1_0_00000001 local_1e2;
  v10 local_1e1;
  v10 *local_1e0;
  size_t local_1d8;
  string local_1d0;
  Error local_1b0;
  cn_cbor *local_188;
  cn_cbor *cbor;
  ByteArray *pBStack_178;
  int aFlags_local;
  ByteArray *aValue_local;
  Sign1Message *pSStack_168;
  int aKey_local;
  Sign1Message *this_local;
  Error *error;
  undefined1 local_140 [16];
  v10 *local_130;
  ulong local_128;
  v10 *local_120;
  size_t sStack_118;
  string *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_108 [2];
  undefined1 local_f8 [16];
  v10 *local_e8;
  ulong local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  v10 **local_80;
  v10 *local_78;
  size_t sStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined1 *local_60;
  Error **local_58;
  undefined1 *local_50;
  Error **local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_40;
  Error **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  cbor._3_1_ = 0;
  cbor._4_4_ = aFlags;
  pBStack_178 = aValue;
  aValue_local._4_4_ = aKey;
  pSStack_168 = this;
  this_local = (Sign1Message *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  local_188 = (cn_cbor *)0x0;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(pBStack_178);
  if (bVar1) {
    AddAttribute::anon_class_1_0_00000001::operator()(&local_1e2);
    local_b8 = &local_1e0;
    local_c0 = &local_1e1;
    bVar3 = ::fmt::v10::operator()(local_c0);
    local_1d8 = bVar3.size_;
    local_1e0 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_c8 = &local_1d0;
    local_d8 = local_1e0;
    sStack_d0 = local_1d8;
    local_a0 = &local_d8;
    local_e8 = local_1e0;
    local_e0 = local_1d8;
    local_98 = local_e8;
    sStack_90 = local_e0;
    local_108[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_60 = local_f8;
    local_68 = local_108;
    local_18 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_e0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_68;
    local_40 = local_68;
    local_20 = local_68;
    local_10 = local_60;
    ::fmt::v10::vformat_abi_cxx11_(&local_1d0,local_e8,fmt,args);
    Error::Error(&local_1b0,kInvalidArgs,&local_1d0);
    Error::operator=(__return_storage_ptr__,&local_1b0);
    Error::~Error(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  else {
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pBStack_178,0);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pBStack_178);
    local_188 = cn_cbor_data_create(data,(int)sVar2,(cn_cbor_errback *)0x0);
    if (local_188 == (cn_cbor *)0x0) {
      AddAttribute::anon_class_1_0_00000001::operator()(&local_252);
      local_a8 = &local_250;
      local_b0 = &local_251;
      bVar3 = ::fmt::v10::operator()(local_b0);
      local_248 = bVar3.size_;
      local_250 = (v10 *)bVar3.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_110 = &local_240;
      local_120 = local_250;
      sStack_118 = local_248;
      local_80 = &local_120;
      local_130 = local_250;
      local_128 = local_248;
      local_78 = local_130;
      sStack_70 = local_128;
      error = (Error *)::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_50 = local_140;
      local_58 = &error;
      local_30 = 0;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_128;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_58;
      local_48 = local_58;
      local_38 = local_58;
      local_28 = local_50;
      ::fmt::v10::vformat_abi_cxx11_(&local_240,local_130,fmt_00,args_00);
      Error::Error(&local_220,kOutOfMemory,&local_240);
      Error::operator=(__return_storage_ptr__,&local_220);
      Error::~Error(&local_220);
      std::__cxx11::string::~string((string *)&local_240);
    }
    else {
      AddAttribute(&local_280,this,aValue_local._4_4_,local_188,cbor._4_4_);
      aError = Error::operator=(__return_storage_ptr__,&local_280);
      local_284 = kNone;
      commissioner::operator!=(aError,&local_284);
      Error::~Error(&local_280);
    }
  }
  if ((local_188 != (cn_cbor *)0x0) && (local_188->parent == (cn_cbor *)0x0)) {
    cn_cbor_free(local_188);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::AddAttribute(int aKey, const ByteArray &aValue, int aFlags)
{
    Error    error;
    cn_cbor *cbor = nullptr;

    VerifyOrExit(!aValue.empty(), error = ERROR_INVALID_ARGS("add empty COSE SIGN1 message attribute"));
    cbor = cn_cbor_data_create(&aValue[0], aValue.size(), nullptr);
    VerifyOrExit(cbor != nullptr, error = ERROR_OUT_OF_MEMORY("add COSE SIGN1 message attribute"));

    SuccessOrExit(error = AddAttribute(aKey, cbor, aFlags));

exit:
    if (cbor != nullptr && cbor->parent == nullptr)
    {
        cn_cbor_free(cbor);
    }
    return error;
}